

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
ArgsManager::GetArg(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *__return_storage_ptr__,ArgsManager *this,string *strArg)

{
  long in_FS_OFFSET;
  SettingsValue value;
  SettingsValue local_70;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  GetSetting(&local_70,this,strArg);
  SettingToString_abi_cxx11_(__return_storage_ptr__,&local_70);
  UniValue::~UniValue(&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::string> ArgsManager::GetArg(const std::string& strArg) const
{
    const common::SettingsValue value = GetSetting(strArg);
    return SettingToString(value);
}